

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_state_rest(Curl_easy *data,connectdata *conn)

{
  ftp_conn *ftpc;
  FTP *ftp;
  CURLcode result;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  if ((((data->req).p.file)->fd == 0) || ((conn->proto).ftpc.file == (char *)0x0)) {
    ftp._4_4_ = ftp_state_prepare_transfer(data);
  }
  else {
    ftp._4_4_ = Curl_pp_sendf(data,&(conn->proto).ftpc.pp,"REST %d",0);
    if (ftp._4_4_ == CURLE_OK) {
      _ftp_state(data,'\x1a');
    }
  }
  return ftp._4_4_;
}

Assistant:

static CURLcode ftp_state_rest(struct Curl_easy *data,
                               struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct FTP *ftp = data->req.p.ftp;
  struct ftp_conn *ftpc = &conn->proto.ftpc;

  if((ftp->transfer != PPTRANSFER_BODY) && ftpc->file) {
    /* if a "head"-like request is being made (on a file) */

    /* Determine if server can respond to REST command and therefore
       whether it supports range */
    result = Curl_pp_sendf(data, &ftpc->pp, "REST %d", 0);
    if(!result)
      ftp_state(data, FTP_REST);
  }
  else
    result = ftp_state_prepare_transfer(data);

  return result;
}